

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O3

err_t bignDH(octet *key,bign_params *params,octet *privkey,octet *pubkey,size_t key_len)

{
  size_t n;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  u64 *dest;
  word *a;
  word *stack;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      sVar4 = bignStart_keep(params->l,bignDH_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bignStart(ec,params);
        if (eVar2 == 0) {
          sVar4 = ec->f->no;
          eVar2 = 0x1fb;
          if (key_len <= sVar4 * 2) {
            n = ec->f->n;
            bVar1 = memIsValid(privkey,sVar4);
            eVar2 = 0x6d;
            if (bVar1 != 0) {
              bVar1 = memIsValid(pubkey,sVar4 * 2);
              if (bVar1 != 0) {
                bVar1 = memIsValid(key,key_len);
                if (bVar1 != 0) {
                  dest = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
                  u64From(dest,privkey,sVar4);
                  bVar1 = wwIsZero(dest,n);
                  eVar2 = 0x1f8;
                  if (bVar1 == 0) {
                    iVar3 = wwCmp(dest,ec->order,n);
                    if (iVar3 < 0) {
                      a = dest + n;
                      stack = a + n * 2;
                      bVar1 = (*ec->f->from)(a,pubkey,ec->f,stack);
                      eVar2 = 0x1f9;
                      if (bVar1 != 0) {
                        bVar1 = (*ec->f->from)(a + n,pubkey + sVar4,ec->f,stack);
                        if (bVar1 != 0) {
                          bVar1 = ecpIsOnA(a,ec,stack);
                          if (bVar1 != 0) {
                            bVar1 = ecMulA(a,a,ec,dest,n,stack);
                            if (bVar1 == 0) {
                              eVar2 = 0x1f6;
                            }
                            else {
                              (*ec->f->to)((octet *)a,a,ec->f,stack);
                              if (sVar4 < key_len) {
                                (*ec->f->to)((octet *)(sVar4 + (long)a),a + n,ec->f,stack);
                              }
                              memCopy(key,a,key_len);
                              eVar2 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignDH(octet key[], const bign_params* params, const octet privkey[],
	const octet pubkey[], size_t key_len)
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignDH_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить длину key
	if (key_len > 2 * no)
	{
		blobClose(state);
		return ERR_BAD_SHAREDKEY;
	}
	// проверить входные указатели
	if (!memIsValid(privkey, no) || 
		!memIsValid(pubkey, 2 * no) ||
		!memIsValid(key, key_len))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack) ||
		!ecpIsOnA(Q, ec, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// Q <- d Q
	if (ecMulA(Q, Q, ec, d, n, stack))
	{
		// выгрузить общий ключ
		qrTo((octet*)Q, ecX(Q), ec->f, stack);
		if (key_len > no)
			qrTo((octet*)Q + no, ecY(Q, n), ec->f, stack);
		memCopy(key, Q, key_len);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}